

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

bool __thiscall
poplar::
compact_bonsai_trie<90U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::add_child(compact_bonsai_trie<90U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
            *this,uint64_t *node_id,uint64_t symb)

{
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong quo;
  uint64_t cnt;
  uint64_t dsp;
  
  uVar3 = bijective_hash::split_mix_hasher::hash
                    (&this->hasher_,
                     *node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb);
  quo = uVar3 >> ((ulong)(byte)(this->capa_size_).bits_ & 0x3f);
  uVar3 = uVar3 & (this->capa_size_).mask_;
  dsp = 1;
  do {
    if (uVar3 != 0) {
      bVar1 = compare_dsp_(this,uVar3,0);
      if (bVar1) {
        if (this->size_ == this->max_size_) {
          return false;
        }
        update_slot_(this,uVar3,quo,dsp);
        this->size_ = this->size_ + 1;
LAB_001545fb:
        *node_id = uVar3;
        return bVar1;
      }
      bVar2 = compare_dsp_(this,uVar3,dsp);
      if ((bVar2) && (uVar4 = get_quo_(this,uVar3), quo == uVar4)) goto LAB_001545fb;
    }
    uVar3 = uVar3 + 1 & (this->capa_size_).mask_;
    dsp = dsp + 1;
  } while( true );
}

Assistant:

bool add_child(uint64_t& node_id, uint64_t symb) {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        auto [quo, mod] = decompose_(hasher_.hash(make_key_(node_id, symb)));

        for (uint64_t i = mod, cnt = 1;; i = right_(i), ++cnt) {
            // because the root's dsp value is zero though it is defined
            if (i == get_root()) {
                continue;
            }

            if (compare_dsp_(i, 0)) {
                // this slot is empty
                if (size_ == max_size_) {
                    return false;  // needs to expand
                }

                update_slot_(i, quo, cnt);

                ++size_;
                node_id = i;

                return true;
            }

            if (compare_dsp_(i, cnt) and quo == get_quo_(i)) {
                node_id = i;
                return false;  // already stored
            }
        }
    }